

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

void N_VConst_ManyVector(sunrealtype c,N_Vector z)

{
  sunindextype i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < *z->content; lVar1 = lVar1 + 1) {
    N_VConst(c,*(undefined8 *)(*(long *)((long)z->content + 0x10) + lVar1 * 8));
  }
  return;
}

Assistant:

void MVAPPEND(N_VConst)(sunrealtype c, N_Vector z)
{
  SUNFunctionBegin(z->sunctx);
  sunindextype i;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(z); i++)
  {
    N_VConst(c, MANYVECTOR_SUBVEC(z, i));
    SUNCheckLastErrVoid();
  }
  return;
}